

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Concat.cpp
# Opt level: O3

void CoreMLConverter::convertCaffeConcat(ConvertLayerParameters layerParameters)

{
  uint uVar1;
  Rep *pRVar2;
  string *psVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  Type *pTVar7;
  Type *pTVar8;
  ConcatLayerParams *this;
  uint uVar9;
  ulong uVar10;
  void **ppvVar11;
  uint uVar12;
  long lVar13;
  long lVar14;
  ConcatParameter *pCVar15;
  long in_stack_00000008;
  string *in_stack_00000018;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_00000028;
  int *in_stack_00000048;
  string __str;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  top;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  bottom;
  string local_e0;
  string local_c0;
  string *local_a0;
  string local_98;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_78;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_58;
  Type *local_38;
  
  pTVar7 = google::protobuf::internal::RepeatedPtrFieldBase::
           Get<google::protobuf::RepeatedPtrField<caffe::LayerParameter>::TypeHandler>
                     ((RepeatedPtrFieldBase *)(in_stack_00000008 + 0x70),*in_stack_00000048);
  pTVar8 = google::protobuf::internal::RepeatedPtrFieldBase::
           Add<google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::TypeHandler>
                     ((RepeatedPtrFieldBase *)in_stack_00000018,(Type *)0x0);
  iVar6 = (pTVar7->bottom_).super_RepeatedPtrFieldBase.current_size_;
  if ((iVar6 < 2) || ((pTVar7->top_).super_RepeatedPtrFieldBase.current_size_ != 1)) {
    local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_e0,"Must have more than 1 input and exactly 1 output","");
    errorInCaffeProto(&local_e0,(pTVar7->name_).ptr_,(pTVar7->type_).ptr_);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
      operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
    }
    iVar6 = (pTVar7->bottom_).super_RepeatedPtrFieldBase.current_size_;
  }
  local_a0 = in_stack_00000018;
  local_58.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_78.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_78.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pRVar2 = (pTVar7->bottom_).super_RepeatedPtrFieldBase.rep_;
  ppvVar11 = pRVar2->elements;
  if (pRVar2 == (Rep *)0x0) {
    ppvVar11 = (void **)0x0;
  }
  local_38 = pTVar8;
  if (iVar6 != 0) {
    lVar13 = 0;
    do {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&local_58,*(value_type **)((long)ppvVar11 + lVar13));
      lVar13 = lVar13 + 8;
    } while ((long)iVar6 * 8 != lVar13);
  }
  pRVar2 = (pTVar7->top_).super_RepeatedPtrFieldBase.rep_;
  ppvVar11 = pRVar2->elements;
  if (pRVar2 == (Rep *)0x0) {
    ppvVar11 = (void **)0x0;
  }
  lVar13 = (long)(pTVar7->top_).super_RepeatedPtrFieldBase.current_size_;
  if (lVar13 != 0) {
    lVar14 = 0;
    do {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&local_78,*(value_type **)((long)ppvVar11 + lVar14));
      lVar14 = lVar14 + 8;
    } while (lVar13 * 8 != lVar14);
  }
  convertCaffeMetadata
            ((pTVar7->name_).ptr_,&local_58,&local_78,
             (RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *)local_a0,
             in_stack_00000028);
  pCVar15 = pTVar7->concat_param_;
  if (pCVar15 == (ConcatParameter *)0x0) {
    pCVar15 = (ConcatParameter *)&caffe::_ConcatParameter_default_instance_;
  }
  if (pCVar15->concat_dim_ != 1) {
    local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,"concat_dim","");
    psVar3 = (pTVar7->name_).ptr_;
    local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"Recurrent","");
    uVar1 = pCVar15->axis_;
    uVar4 = -uVar1;
    if (0 < (int)uVar1) {
      uVar4 = uVar1;
    }
    uVar12 = 1;
    if (9 < uVar4) {
      uVar10 = (ulong)uVar4;
      uVar5 = 4;
      do {
        uVar12 = uVar5;
        uVar9 = (uint)uVar10;
        if (uVar9 < 100) {
          uVar12 = uVar12 - 2;
          goto LAB_003d5633;
        }
        if (uVar9 < 1000) {
          uVar12 = uVar12 - 1;
          goto LAB_003d5633;
        }
        if (uVar9 < 10000) goto LAB_003d5633;
        uVar10 = uVar10 / 10000;
        uVar5 = uVar12 + 4;
      } while (99999 < uVar9);
      uVar12 = uVar12 + 1;
    }
LAB_003d5633:
    local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
    local_a0 = psVar3;
    std::__cxx11::string::_M_construct((ulong)&local_98,(char)uVar12 - (char)((int)uVar1 >> 0x1f));
    std::__detail::__to_chars_10_impl<unsigned_int>
              (local_98._M_dataplus._M_p + (uVar1 >> 0x1f),uVar12,uVar4);
    unsupportedCaffeParrameterWithOption(&local_e0,local_a0,&local_c0,&local_98);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
      operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
      operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
    }
  }
  if (pCVar15->axis_ != 1) {
    local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,"axis","");
    psVar3 = (pTVar7->name_).ptr_;
    local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"Recurrent","");
    uVar1 = pCVar15->axis_;
    uVar4 = -uVar1;
    if (0 < (int)uVar1) {
      uVar4 = uVar1;
    }
    uVar12 = 1;
    if (9 < uVar4) {
      uVar10 = (ulong)uVar4;
      uVar5 = 4;
      do {
        uVar12 = uVar5;
        uVar9 = (uint)uVar10;
        if (uVar9 < 100) {
          uVar12 = uVar12 - 2;
          goto LAB_003d578d;
        }
        if (uVar9 < 1000) {
          uVar12 = uVar12 - 1;
          goto LAB_003d578d;
        }
        if (uVar9 < 10000) goto LAB_003d578d;
        uVar10 = uVar10 / 10000;
        uVar5 = uVar12 + 4;
      } while (99999 < uVar9);
      uVar12 = uVar12 + 1;
    }
LAB_003d578d:
    local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
    std::__cxx11::string::_M_construct((ulong)&local_98,(char)uVar12 - (char)((int)uVar1 >> 0x1f));
    std::__detail::__to_chars_10_impl<unsigned_int>
              (local_98._M_dataplus._M_p + (uVar1 >> 0x1f),uVar12,uVar4);
    unsupportedCaffeParrameterWithOption(&local_e0,psVar3,&local_c0,&local_98);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
      operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
      operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
    }
  }
  pTVar8 = local_38;
  if (local_38->_oneof_case_[0] != 0x140) {
    CoreML::Specification::NeuralNetworkLayer::clear_layer(local_38);
    pTVar8->_oneof_case_[0] = 0x140;
    this = (ConcatLayerParams *)operator_new(0x18);
    CoreML::Specification::ConcatLayerParams::ConcatLayerParams(this);
    (pTVar8->layer_).concat_ = this;
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_78);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_58);
  return;
}

Assistant:

void CoreMLConverter::convertCaffeConcat(CoreMLConverter::ConvertLayerParameters layerParameters) {
    
    int layerId = *layerParameters.layerId;
    const caffe::LayerParameter& caffeLayer = layerParameters.prototxt.layer(layerId);
    std::map<std::string, std::string>& mappingDataBlobNames = layerParameters.mappingDataBlobNames;
    
    //Write Layer metadata
    auto* nnWrite = layerParameters.nnWrite;
    Specification::NeuralNetworkLayer* specLayer = nnWrite->Add();
    if (caffeLayer.bottom_size() <= 1 || caffeLayer.top_size() != 1) {
        CoreMLConverter::errorInCaffeProto("Must have more than 1 input and exactly 1 output",caffeLayer.name(),caffeLayer.type());
    }
    
    std::vector<std::string> bottom;
    std::vector<std::string> top;
    for (const auto& bottomName: caffeLayer.bottom()){
        bottom.push_back(bottomName);
    }
    for (const auto& topName: caffeLayer.top()){
        top.push_back(topName);
    }
    CoreMLConverter::convertCaffeMetadata(caffeLayer.name(), 
                                         bottom, top,
                                         nnWrite, mappingDataBlobNames);
    
    const caffe::ConcatParameter& caffeLayerParams = caffeLayer.concat_param();
    
    //***************** Some Error Checking in Caffe Proto **********
    if (caffeLayerParams.concat_dim() != 1) {
        CoreMLConverter::unsupportedCaffeParrameterWithOption("concat_dim", caffeLayer.name(), "Recurrent",
                                                           std::to_string(caffeLayerParams.axis()));

    }
    if (caffeLayerParams.axis() != 1) {
        CoreMLConverter::unsupportedCaffeParrameterWithOption("axis",caffeLayer.name(), "Recurrent",
                                        std::to_string(caffeLayerParams.axis()));
    }
    //**************************************************************

    
    (void) specLayer->mutable_concat();
}